

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O0

void __thiscall cppnet::Thread::~Thread(Thread *this)

{
  code *pcVar1;
  Thread *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Thread() {}